

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

void * mz_zip_reader_extract_file_to_heap
                 (mz_zip_archive *pZip,char *pFilename,size_t *pSize,mz_uint flags)

{
  mz_bool mVar1;
  mz_uint local_30;
  mz_uint local_2c;
  mz_uint32 file_index;
  mz_uint flags_local;
  size_t *pSize_local;
  char *pFilename_local;
  mz_zip_archive *pZip_local;
  
  local_2c = flags;
  _file_index = pSize;
  pSize_local = (size_t *)pFilename;
  pFilename_local = (char *)pZip;
  mVar1 = mz_zip_reader_locate_file_v2(pZip,pFilename,(char *)0x0,flags,&local_30);
  if (mVar1 == 0) {
    if (_file_index != (size_t *)0x0) {
      *_file_index = 0;
    }
    pZip_local = (mz_zip_archive *)0x0;
  }
  else {
    pZip_local = (mz_zip_archive *)
                 mz_zip_reader_extract_to_heap
                           ((mz_zip_archive *)pFilename_local,local_30,_file_index,local_2c);
  }
  return pZip_local;
}

Assistant:

void *mz_zip_reader_extract_file_to_heap(mz_zip_archive *pZip, const char *pFilename, size_t *pSize, mz_uint flags)
{
    mz_uint32 file_index;
    if (!mz_zip_reader_locate_file_v2(pZip, pFilename, NULL, flags, &file_index))
    {
        if (pSize)
            *pSize = 0;
        return MZ_FALSE;
    }
    return mz_zip_reader_extract_to_heap(pZip, file_index, pSize, flags);
}